

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.hpp
# Opt level: O0

void __thiscall Simulator::ClockReg<Simulator::MRegX>::tick(ClockReg<Simulator::MRegX> *this)

{
  byte *in_RDI;
  
  if ((in_RDI[1] & 1) == 0) {
    if ((*in_RDI & 1) == 0) {
      memcpy(in_RDI + 0x38,in_RDI + 8,0x30);
    }
    else {
      *in_RDI = 0;
    }
  }
  else {
    in_RDI[0x38] = 0;
    in_RDI[0x39] = 0;
    in_RDI[0x3a] = 0;
    in_RDI[0x3b] = 0;
    in_RDI[0x60] = 0;
    in_RDI[0x61] = 0;
    in_RDI[0x62] = 0;
    in_RDI[99] = 0;
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

void tick() {
            if (bubble) {
                out.opcode = RISCV_GRX::OP_BUBBLE;
                out.inst = RISCV_GRX::UNKNOWN;
                bubble = stall = false;
//                out.stall_count = 0;
            } else if (stall) {
                stall = false;
            } else {
                out = in;
            }
        }